

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O2

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry::Entry
          (Entry *this,Slot *slot,Connection *conn)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  std::function<void_()>::function(&this->slot_,slot);
  (this->conn_).super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (conn->super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (conn->super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (conn->super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->conn_).super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  (this->conn_).super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (conn->super___shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->signal_ = (BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)0x0;
  return;
}

Assistant:

Entry(const Slot &slot, Connection conn) noexcept
      : slot_(slot), conn_(std::move(conn)), signal_(nullptr)
    {
    }